

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

size_type __thiscall
QMapData<std::map<int,_QTuioToken,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioToken>_>_>_>
::copyIfNotEquivalentTo
          (QMapData<std::map<int,_QTuioToken,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioToken>_>_>_>
           *this,Map *source,Key *key)

{
  insert_iterator<std::map<int,_QTuioToken,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioToken>_>_>_>
  __result;
  anon_class_24_3_4618db99_for__M_pred __pred;
  key_compare *in_RDX;
  _Iter in_RSI;
  _Rb_tree_const_iterator<std::pair<const_int,_QTuioToken>_> in_RDI;
  long in_FS_OFFSET;
  key_compare *keyCompare;
  anon_class_24_3_4618db99_for__M_pred filter;
  size_type result;
  map<int,_QTuioToken,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioToken>_>_>
  *in_stack_ffffffffffffff08;
  map<int,_QTuioToken,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioToken>_>_>
  *in_stack_ffffffffffffff10;
  map<int,_QTuioToken,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioToken>_>_>
  *in_stack_ffffffffffffff18;
  iterator __i;
  undefined8 in_stack_ffffffffffffffc0;
  _Rb_tree_const_iterator<std::pair<const_int,_QTuioToken>_> __first;
  key_compare *pkVar1;
  size_type local_10;
  _Base_ptr local_8;
  
  local_8 = *(_Base_ptr *)(in_FS_OFFSET + 0x28);
  local_10 = 0;
  __i._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
  std::map<int,_QTuioToken,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioToken>_>_>::
  key_comp(in_stack_ffffffffffffff10);
  __first._M_node = (_Base_ptr)&stack0xfffffffffffffff0;
  pkVar1 = in_RDX;
  std::map<int,_QTuioToken,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioToken>_>_>::
  cbegin(in_stack_ffffffffffffff08);
  std::map<int,_QTuioToken,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioToken>_>_>::
  cend(in_stack_ffffffffffffff08);
  std::map<int,_QTuioToken,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioToken>_>_>::end
            (in_stack_ffffffffffffff08);
  std::
  inserter<std::map<int,QTuioToken,std::less<int>,std::allocator<std::pair<int_const,QTuioToken>>>>
            (in_stack_ffffffffffffff18,__i);
  __result.iter._M_node = in_RSI._M_node;
  __result.container =
       (map<int,_QTuioToken,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioToken>_>_> *)
       in_RDX;
  __pred.key = (Key *)__first._M_node;
  __pred.result = (size_type *)in_stack_ffffffffffffffc0;
  __pred.keyCompare = pkVar1;
  std::
  remove_copy_if<std::_Rb_tree_const_iterator<std::pair<int_const,QTuioToken>>,std::insert_iterator<std::map<int,QTuioToken,std::less<int>,std::allocator<std::pair<int_const,QTuioToken>>>>,QMapData<std::map<int,QTuioToken,std::less<int>,std::allocator<std::pair<int_const,QTuioToken>>>>::copyIfNotEquivalentTo(std::map<int,QTuioToken,std::less<int>,std::allocator<std::pair<int_const,QTuioToken>>>const&,int_const&)::_lambda(auto:1_const&)_1_>
            (__first,in_RDI,__result,__pred);
  if (*(_Base_ptr *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

size_type copyIfNotEquivalentTo(const Map &source, const Key &key)
    {
        Q_ASSERT(m.empty());

        size_type result = 0;
        const auto &keyCompare = source.key_comp();
        const auto filter = [&result, &key, &keyCompare](const auto &v)
        {
            if (!keyCompare(key, v.first) && !keyCompare(v.first, key)) {
                // keys are equivalent (neither a<b nor b<a) => found it
                ++result;
                return true;
            }
            return false;
        };

        std::remove_copy_if(source.cbegin(), source.cend(),
                            std::inserter(m, m.end()),
                            filter);
        return result;
    }